

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

bool __thiscall Bstrlib::CBString::operator<=(CBString *this,uchar *s)

{
  int iVar1;
  CBStringException *this_00;
  allocator local_59;
  string local_58;
  CBStringException bstr__cppwrapper_exception;
  
  if (s != (uchar *)0x0) {
    iVar1 = strcmp((char *)(this->super_tagbstring).data,(char *)s);
    return iVar1 < 1;
  }
  std::__cxx11::string::string((string *)&local_58,"CBString::Failure in compare (<=)",&local_59);
  CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,&bstr__cppwrapper_exception);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

bool CBString::operator <= (const unsigned char * s) const {
	if (s == NULL) {
		bstringThrow ("Failure in compare (<=)");
	}
	return strcmp ((const char *)this->data, (const char *)s) <= 0;
}